

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenMutate
          (string *__return_storage_ptr__,SwiftGenerator *this,string *offset,string *get_offset,
          bool isRaw)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,
                 "@discardableResult {{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}) -> Bool {"
                 ,get_offset);
  std::operator+(&local_c0,&local_40," return {{ACCESS}}.mutate({{FIELDVAR}}");
  __rhs = "";
  if (isRaw) {
    __rhs = ".rawValue";
  }
  std::operator+(&local_a0,&local_c0,__rhs);
  std::operator+(&local_80,&local_a0,", index: ");
  std::operator+(&local_60,&local_80,offset);
  std::operator+(__return_storage_ptr__,&local_60,") }");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenMutate(const std::string &offset,
                        const std::string &get_offset, bool isRaw = false) {
    return "@discardableResult {{ACCESS_TYPE}} func mutate({{FIELDVAR}}: "
           "{{VALUETYPE}}) -> Bool {" +
           get_offset + " return {{ACCESS}}.mutate({{FIELDVAR}}" +
           (isRaw ? ".rawValue" : "") + ", index: " + offset + ") }";
  }